

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# draco_encoder.cc
# Opt level: O1

void anon_unknown.dwarf_8295::Usage(void)

{
  puts("Usage: draco_encoder [options] -i input");
  putchar(10);
  puts("Main options:");
  puts("  -h | -?               show help.");
  puts("  -i <input>            input file name.");
  puts("  -o <output>           output file name.");
  puts("  -point_cloud          forces the input to be encoded as a point cloud.");
  puts("  -qp <value>           quantization bits for the position attribute, default=11.");
  puts("  -qt <value>           quantization bits for the texture coordinate attribute, default=10."
      );
  puts("  -qn <value>           quantization bits for the normal vector attribute, default=8.");
  puts("  -qg <value>           quantization bits for any generic attribute, default=8.");
  puts("  -cl <value>           compression level [0-10], most=10, least=0, default=7.");
  puts("  --skip ATTRIBUTE_NAME skip a given attribute (NORMAL, TEX_COORD, GENERIC)");
  puts("  --metadata            use metadata to encode extra information in mesh files.");
  puts("  -preserve_polygons    encode polygon info as an attribute.");
  puts("\nUse negative quantization values to skip the specified attribute");
  return;
}

Assistant:

void Usage() {
  printf("Usage: draco_encoder [options] -i input\n");
  printf("\n");
  printf("Main options:\n");
  printf("  -h | -?               show help.\n");
  printf("  -i <input>            input file name.\n");
  printf("  -o <output>           output file name.\n");
  printf(
      "  -point_cloud          forces the input to be encoded as a point "
      "cloud.\n");
  printf(
      "  -qp <value>           quantization bits for the position "
      "attribute, default=11.\n");
  printf(
      "  -qt <value>           quantization bits for the texture coordinate "
      "attribute, default=10.\n");
  printf(
      "  -qn <value>           quantization bits for the normal vector "
      "attribute, default=8.\n");
  printf(
      "  -qg <value>           quantization bits for any generic attribute, "
      "default=8.\n");
  printf(
      "  -cl <value>           compression level [0-10], most=10, least=0, "
      "default=7.\n");
  printf(
      "  --skip ATTRIBUTE_NAME skip a given attribute (NORMAL, TEX_COORD, "
      "GENERIC)\n");
  printf(
      "  --metadata            use metadata to encode extra information in "
      "mesh files.\n");
  // Mesh with polygonal faces loaded from OBJ format is converted to triangular
  // mesh and polygon reconstruction information is encoded into a new generic
  // attribute.
  printf("  -preserve_polygons    encode polygon info as an attribute.\n");

  printf(
      "\nUse negative quantization values to skip the specified attribute\n");
}